

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
::grow(SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
       *this,size_t MinSize)

{
  move_iterator<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>_*> __first;
  void *pvVar1;
  void *__ptr;
  SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
  *__ptr_00;
  ulong uVar2;
  pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *__result;
  ulong uVar3;
  long lVar4;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar2 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                 ).super_SmallVectorBase.Capacity + 2;
  uVar3 = uVar2 >> 1 | uVar2;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar2 = (uVar2 >> 0x20 | uVar3 >> 0x10 | uVar3) + 1;
  if (uVar2 <= MinSize) {
    uVar2 = MinSize;
  }
  if (0xfffffffe < uVar2) {
    uVar2 = 0xffffffff;
  }
  __result = (pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *)malloc(uVar2 * 0x18);
  if (__result == (pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  __first._M_current =
       (pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *)
       (this->
       super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
       ).super_SmallVectorBase.BeginX;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>*>,std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>*>
            (__first,__first._M_current +
                     (this->
                     super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                     ).super_SmallVectorBase.Size,__result);
  uVar3 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                 ).super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    pvVar1 = (this->
             super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
             ).super_SmallVectorBase.BeginX;
    lVar4 = uVar3 * 0x18;
    do {
      __ptr = *(void **)((long)pvVar1 + lVar4 + -0x10);
      if ((void *)((long)pvVar1 + lVar4) != __ptr) {
        free(__ptr);
      }
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  __ptr_00 = (SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
              *)(this->
                super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                ).super_SmallVectorBase.BeginX;
  if (__ptr_00 != this + 1) {
    free(__ptr_00);
  }
  (this->
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
  ).super_SmallVectorBase.BeginX = __result;
  (this->
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
  ).super_SmallVectorBase.Capacity = (uint)uVar2;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}